

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

int pkcs12_encode_password(char *in,size_t in_len,uint8_t **out,size_t *out_len)

{
  int iVar1;
  cbb_st *pcVar2;
  size_t sVar3;
  uint32_t local_7c;
  undefined1 local_78 [4];
  uint32_t c;
  CBS cbs;
  undefined1 local_60 [8];
  ScopedCBB cbb;
  size_t *out_len_local;
  uint8_t **out_local;
  size_t in_len_local;
  char *in_local;
  
  cbb.ctx_.u._24_8_ = out_len;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_60);
  pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_60);
  iVar1 = CBB_init(pcVar2,in_len << 1);
  if (iVar1 == 0) {
    in_local._4_4_ = 0;
  }
  else {
    CBS_init((CBS *)local_78,(uint8_t *)in,in_len);
    do {
      sVar3 = CBS_len((CBS *)local_78);
      if (sVar3 == 0) {
        pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_60);
        iVar1 = CBB_add_ucs2_be(pcVar2,0);
        if (iVar1 != 0) {
          pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_60);
          iVar1 = CBB_finish(pcVar2,out,(size_t *)cbb.ctx_.u._24_8_);
          if (iVar1 != 0) {
            in_local._4_4_ = 1;
            goto LAB_008159e3;
          }
        }
        in_local._4_4_ = 0;
        goto LAB_008159e3;
      }
      iVar1 = CBS_get_utf8((CBS *)local_78,&local_7c);
      if (iVar1 == 0) break;
      pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_60);
      iVar1 = CBB_add_ucs2_be(pcVar2,local_7c);
    } while (iVar1 != 0);
    ERR_put_error(0x13,0,0x83,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,0x30);
    in_local._4_4_ = 0;
  }
LAB_008159e3:
  cbs.len._4_4_ = 1;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_60);
  return in_local._4_4_;
}

Assistant:

static int pkcs12_encode_password(const char *in, size_t in_len, uint8_t **out,
                                  size_t *out_len) {
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), in_len * 2)) {
    return 0;
  }

  // Convert the password to BMPString, or UCS-2. See
  // https://tools.ietf.org/html/rfc7292#appendix-B.1.
  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)in, in_len);
  while (CBS_len(&cbs) != 0) {
    uint32_t c;
    if (!CBS_get_utf8(&cbs, &c) || !CBB_add_ucs2_be(cbb.get(), c)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_INVALID_CHARACTERS);
      return 0;
    }
  }

  // Terminate the result with a UCS-2 NUL.
  if (!CBB_add_ucs2_be(cbb.get(), 0) || !CBB_finish(cbb.get(), out, out_len)) {
    return 0;
  }

  return 1;
}